

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O1

void cvui::internal::image(cvui_block_t *theBlock,int theX,int theY,Mat *theImage)

{
  Rect aRect;
  Size local_28;
  Rect local_20;
  
  local_20._8_8_ = *(ulong *)(theImage + 8) << 0x20 | *(ulong *)(theImage + 8) >> 0x20;
  local_20.x = theX;
  local_20.y = theY;
  render::image(theBlock,&local_20,theImage);
  local_28 = (Size)(*(ulong *)(theImage + 8) << 0x20 | *(ulong *)(theImage + 8) >> 0x20);
  updateLayoutFlow(theBlock,&local_28);
  return;
}

Assistant:

void image(cvui_block_t& theBlock, int theX, int theY, cv::Mat& theImage) {
		cv::Rect aRect(theX, theY, theImage.cols, theImage.rows);

		// TODO: check for render outside the frame area
		render::image(theBlock, aRect, theImage);

		// Update the layout flow according to image size
		cv::Size aSize(theImage.cols, theImage.rows);
		updateLayoutFlow(theBlock, aSize);
	}